

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

ValueType __thiscall Jinx::Variant::GetValType(Variant *this)

{
  bool bVar1;
  undefined1 local_40 [8];
  Variant v;
  Variant *this_local;
  
  v.field_1._24_8_ = this;
  bVar1 = IsValType(this);
  if (bVar1) {
    this_local._4_4_ = (this->field_1).m_valType;
  }
  else {
    Variant((Variant *)local_40,this);
    bVar1 = ConvertTo((Variant *)local_40,ValType);
    if (bVar1) {
      this_local._4_4_ = GetValType((Variant *)local_40);
    }
    else {
      this_local._4_4_ = Null;
    }
    ~Variant((Variant *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

inline ValueType Variant::GetValType() const
	{
		if (IsValType())
			return m_valType;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::ValType))
			return ValueType::Null;
		return v.GetValType();
	}